

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O0

void __thiscall wasm::BinaryInstWriter::visitSIMDShift(BinaryInstWriter *this,SIMDShift *curr)

{
  BufferWithRandomAccess *pBVar1;
  U32LEB local_48;
  U32LEB local_44;
  U32LEB local_40;
  U32LEB local_3c;
  U32LEB local_38;
  U32LEB local_34;
  U32LEB local_30;
  U32LEB local_2c;
  U32LEB local_28;
  U32LEB local_24;
  U32LEB local_20;
  U32LEB local_1c;
  SIMDShift *local_18;
  SIMDShift *curr_local;
  BinaryInstWriter *this_local;
  
  local_18 = curr;
  curr_local = (SIMDShift *)this;
  BufferWithRandomAccess::operator<<(this->o,-3);
  switch(local_18->op) {
  case ShlVecI8x16:
    pBVar1 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB(&local_1c,0x6b);
    BufferWithRandomAccess::operator<<(pBVar1,local_1c);
    break;
  case ShrSVecI8x16:
    pBVar1 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB(&local_20,0x6c);
    BufferWithRandomAccess::operator<<(pBVar1,local_20);
    break;
  case ShrUVecI8x16:
    pBVar1 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB(&local_24,0x6d);
    BufferWithRandomAccess::operator<<(pBVar1,local_24);
    break;
  case ShlVecI16x8:
    pBVar1 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB(&local_28,0x8b);
    BufferWithRandomAccess::operator<<(pBVar1,local_28);
    break;
  case ShrSVecI16x8:
    pBVar1 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB(&local_2c,0x8c);
    BufferWithRandomAccess::operator<<(pBVar1,local_2c);
    break;
  case ShrUVecI16x8:
    pBVar1 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB(&local_30,0x8d);
    BufferWithRandomAccess::operator<<(pBVar1,local_30);
    break;
  case ShlVecI32x4:
    pBVar1 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB(&local_34,0xab);
    BufferWithRandomAccess::operator<<(pBVar1,local_34);
    break;
  case ShrSVecI32x4:
    pBVar1 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB(&local_38,0xac);
    BufferWithRandomAccess::operator<<(pBVar1,local_38);
    break;
  case ShrUVecI32x4:
    pBVar1 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB(&local_3c,0xad);
    BufferWithRandomAccess::operator<<(pBVar1,local_3c);
    break;
  case ShlVecI64x2:
    pBVar1 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB(&local_40,0xcb);
    BufferWithRandomAccess::operator<<(pBVar1,local_40);
    break;
  case ShrSVecI64x2:
    pBVar1 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB(&local_44,0xcc);
    BufferWithRandomAccess::operator<<(pBVar1,local_44);
    break;
  case ShrUVecI64x2:
    pBVar1 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB(&local_48,0xcd);
    BufferWithRandomAccess::operator<<(pBVar1,local_48);
  }
  return;
}

Assistant:

void BinaryInstWriter::visitSIMDShift(SIMDShift* curr) {
  o << int8_t(BinaryConsts::SIMDPrefix);
  switch (curr->op) {
    case ShlVecI8x16:
      o << U32LEB(BinaryConsts::I8x16Shl);
      break;
    case ShrSVecI8x16:
      o << U32LEB(BinaryConsts::I8x16ShrS);
      break;
    case ShrUVecI8x16:
      o << U32LEB(BinaryConsts::I8x16ShrU);
      break;
    case ShlVecI16x8:
      o << U32LEB(BinaryConsts::I16x8Shl);
      break;
    case ShrSVecI16x8:
      o << U32LEB(BinaryConsts::I16x8ShrS);
      break;
    case ShrUVecI16x8:
      o << U32LEB(BinaryConsts::I16x8ShrU);
      break;
    case ShlVecI32x4:
      o << U32LEB(BinaryConsts::I32x4Shl);
      break;
    case ShrSVecI32x4:
      o << U32LEB(BinaryConsts::I32x4ShrS);
      break;
    case ShrUVecI32x4:
      o << U32LEB(BinaryConsts::I32x4ShrU);
      break;
    case ShlVecI64x2:
      o << U32LEB(BinaryConsts::I64x2Shl);
      break;
    case ShrSVecI64x2:
      o << U32LEB(BinaryConsts::I64x2ShrS);
      break;
    case ShrUVecI64x2:
      o << U32LEB(BinaryConsts::I64x2ShrU);
      break;
  }
}